

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_PLTE(LodePNGColorMode *color,uchar *data,size_t chunkLength)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  color->palettesize = chunkLength / 3;
  uVar1 = 0x26;
  if (0xfffffffffffffcff < chunkLength - 0x303) {
    lodepng_color_mode_alloc_palette(color);
    if ((color->palette == (uchar *)0x0) && (color->palettesize != 0)) {
      color->palettesize = 0;
      uVar1 = 0x53;
    }
    else {
      uVar1 = 0;
      if (color->palettesize != 0) {
        uVar2 = 3;
        uVar3 = 1;
        uVar4 = 1;
        do {
          color->palette[uVar2 - 3] = data[uVar3 - 1];
          color->palette[uVar2 - 2] = data[uVar3];
          color->palette[uVar2 - 1] = data[uVar3 + 1];
          color->palette[uVar2] = 0xff;
          uVar5 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
          uVar2 = uVar2 + 4;
          uVar3 = uVar3 + 3;
        } while (color->palettesize != uVar5);
      }
    }
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_PLTE(LodePNGColorMode* color, const unsigned char* data, size_t chunkLength) {
  unsigned pos = 0, i;
  color->palettesize = chunkLength / 3u;
  if (color->palettesize == 0 || color->palettesize > 256) return 38; /*error: palette too small or big*/
  lodepng_color_mode_alloc_palette(color);
  if (!color->palette && color->palettesize) {
    color->palettesize = 0;
    return 83; /*alloc fail*/
  }

  for (i = 0; i != color->palettesize; ++i) {
    color->palette[4 * i + 0] = data[pos++]; /*R*/
    color->palette[4 * i + 1] = data[pos++]; /*G*/
    color->palette[4 * i + 2] = data[pos++]; /*B*/
    color->palette[4 * i + 3] = 255; /*alpha*/
  }

  return 0; /* OK */
}